

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl2.cpp
# Opt level: O2

void ImGui_ImplOpenGL2_DestroyFontsTexture(void)

{
  ImGuiIO *pIVar1;
  ImGui_ImplOpenGL2_Data *pIVar2;
  
  pIVar1 = ImGui::GetIO();
  pIVar2 = ImGui_ImplOpenGL2_GetBackendData();
  if (pIVar2->FontTexture != 0) {
    glDeleteTextures(1,pIVar2);
    pIVar1->Fonts->TexID = (ImTextureID)0x0;
    pIVar2->FontTexture = 0;
  }
  return;
}

Assistant:

void ImGui_ImplOpenGL2_DestroyFontsTexture()
{
    ImGuiIO& io = ImGui::GetIO();
    ImGui_ImplOpenGL2_Data* bd = ImGui_ImplOpenGL2_GetBackendData();
    if (bd->FontTexture)
    {
        glDeleteTextures(1, &bd->FontTexture);
        io.Fonts->SetTexID(0);
        bd->FontTexture = 0;
    }
}